

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

aiNode * get_node_for_mesh(uint meshIndex,aiNode *node)

{
  uint *puVar1;
  uint uVar2;
  aiNode *paVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (node->mNumMeshes == uVar4) {
      uVar2 = node->mNumChildren;
      uVar4 = 0;
      do {
        if (uVar2 == uVar4) {
          return (aiNode *)0x0;
        }
        paVar3 = get_node_for_mesh(meshIndex,node->mChildren[uVar4]);
        uVar4 = uVar4 + 1;
      } while (paVar3 == (aiNode *)0x0);
      return paVar3;
    }
    puVar1 = node->mMeshes + uVar4;
    uVar4 = uVar4 + 1;
  } while (*puVar1 != meshIndex);
  return node;
}

Assistant:

aiNode* get_node_for_mesh(unsigned int meshIndex, aiNode* node)
{
    for (size_t i = 0; i < node->mNumMeshes; ++i) {
        if (node->mMeshes[i] == meshIndex) {
            return node;
        }
    }
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        aiNode* ret = get_node_for_mesh(meshIndex, node->mChildren[i]);
        if (ret) { return ret; }
    }
    return nullptr;
}